

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O0

void bloaty::macho::ParseLoadCommand(LoadCommand *cmd,RangeSink *sink)

{
  int iVar1;
  void *in_RDI;
  RangeSink *in_stack_00000038;
  LoadCommand *in_stack_00000040;
  RangeSink *in_stack_00000068;
  LoadCommand *in_stack_00000070;
  undefined1 in_stack_00000100 [40];
  char *in_stack_ffffffffffffff18;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff20;
  RangeSink *in_stack_ffffffffffffff58;
  LoadCommand *in_stack_ffffffffffffff60;
  string_view in_stack_ffffffffffffff68;
  RangeSink *in_stack_ffffffffffffff98;
  LoadCommand *in_stack_ffffffffffffffa0;
  undefined1 local_38 [56];
  
  iVar1 = *(int *)((long)in_RDI + 4);
  if (iVar1 != -0x7fffffde) {
    if (iVar1 == 1) {
      memcpy(&stack0xffffffffffffffa0,in_RDI,0x28);
      ParseSegment<segment_command,section>((LoadCommand)in_stack_00000100,(RangeSink *)cmd);
      return;
    }
    if (iVar1 == 2) {
      ParseSymbolTable(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      return;
    }
    if (iVar1 == 0xb) {
      ParseDynamicSymbolTable(in_stack_00000070,in_stack_00000068);
      return;
    }
    if (iVar1 == 0x19) {
      memcpy(local_38,in_RDI,0x28);
      ParseSegment<segment_command_64,section_64>((LoadCommand)in_stack_00000100,(RangeSink *)cmd);
      return;
    }
    if (iVar1 == 0x1d) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      ParseLinkeditCommand
                (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      return;
    }
    if (iVar1 == 0x1e) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      ParseLinkeditCommand
                (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      return;
    }
    if (iVar1 != 0x22) {
      if (iVar1 == 0x26) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        ParseLinkeditCommand
                  (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        return;
      }
      if (iVar1 == 0x29) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        ParseLinkeditCommand
                  (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        return;
      }
      if (iVar1 == 0x2b) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        ParseLinkeditCommand
                  (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        return;
      }
      if (iVar1 != 0x2e) {
        return;
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      ParseLinkeditCommand
                (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      return;
    }
  }
  ParseDyldInfo(in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

void ParseLoadCommand(const LoadCommand& cmd, RangeSink* sink) {
  switch (cmd.cmd) {
    case LC_SEGMENT_64:
      ParseSegment<segment_command_64, section_64>(cmd, sink);
      break;
    case LC_SEGMENT:
      ParseSegment<segment_command, section>(cmd, sink);
      break;
    case LC_DYLD_INFO:
    case LC_DYLD_INFO_ONLY:
      ParseDyldInfo(cmd, sink);
      break;
    case LC_SYMTAB:
      ParseSymbolTable(cmd, sink);
      break;
    case LC_DYSYMTAB:
      ParseDynamicSymbolTable(cmd, sink);
      break;
    case LC_CODE_SIGNATURE:
      ParseLinkeditCommand("Code Signature", cmd, sink);
      break;
    case LC_SEGMENT_SPLIT_INFO:
      ParseLinkeditCommand("Segment Split Info", cmd, sink);
      break;
    case LC_FUNCTION_STARTS:
      ParseLinkeditCommand("Function Start Addresses", cmd, sink);
      break;
    case LC_DATA_IN_CODE:
      ParseLinkeditCommand("Table of Non-instructions", cmd, sink);
      break;
    case LC_DYLIB_CODE_SIGN_DRS:
      ParseLinkeditCommand("Code Signing DRs", cmd, sink);
      break;
    case LC_LINKER_OPTIMIZATION_HINT:
      ParseLinkeditCommand("Optimization Hints", cmd, sink);
      break;
  }
}